

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O3

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariableForAt(cmCommandArgumentParserHelper *this,char *var)

{
  char *pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string ref;
  string local_108;
  string local_e8;
  char *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 local_88 [32];
  undefined8 local_68;
  undefined8 local_60;
  char *local_58;
  char local_50 [32];
  
  if (this->ReplaceAtSyntax == true) {
    pcVar1 = ExpandVariable(this,var);
    if (pcVar1 != (char *)0x0) {
      return pcVar1;
    }
    if (this->RemoveEmpty == true) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
      pcVar1 = AddString(this,&local_e8);
      local_108.field_2._M_allocated_capacity = local_e8.field_2._M_allocated_capacity;
      local_108._M_dataplus._M_p = local_e8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
        return pcVar1;
      }
      goto LAB_004c4cbd;
    }
  }
  local_e8._M_string_length = (size_type)local_50;
  local_68 = 0;
  local_60 = 1;
  local_50[0] = '@';
  local_e8._M_dataplus._M_p = (pointer)0x1;
  local_e8.field_2._M_allocated_capacity = 0;
  local_58 = (char *)local_e8._M_string_length;
  local_e8.field_2._8_8_ = strlen(var);
  local_c0 = 0;
  local_b0 = local_88;
  local_a0 = 0;
  local_98 = 1;
  local_88[0] = 0x40;
  local_b8 = 1;
  local_a8 = 0;
  views._M_len = 3;
  views._M_array = (iterator)&local_e8;
  local_c8 = var;
  local_90 = local_b0;
  cmCatViews(&local_108,views);
  pcVar1 = AddString(this,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p == &local_108.field_2) {
    return pcVar1;
  }
LAB_004c4cbd:
  operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  return pcVar1;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandVariableForAt(const char* var)
{
  if (this->ReplaceAtSyntax) {
    // try to expand the variable
    const char* ret = this->ExpandVariable(var);
    // if the return was 0 and we want to replace empty strings
    // then return an empty string
    if (!ret && this->RemoveEmpty) {
      return this->AddString("");
    }
    // if the ret was not 0, then return it
    if (ret) {
      return ret;
    }
  }
  // at this point we want to put it back because of one of these cases:
  // - this->ReplaceAtSyntax is false
  // - this->ReplaceAtSyntax is true, but this->RemoveEmpty is false,
  //   and the variable was not defined
  std::string ref = cmStrCat('@', var, '@');
  return this->AddString(ref);
}